

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::TableBox::layout(TableBox *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  reference pvVar4;
  int *piVar5;
  pair<int,_int> local_88;
  int local_80;
  int local_7c;
  int j_1;
  int i_1;
  int current_row;
  int current_col;
  int local_68;
  int local_64;
  int j;
  int i;
  undefined1 local_58 [8];
  vector<int,_std::allocator<int>_> col_sizes;
  allocator<int> local_2d;
  value_type_conflict1 local_2c;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> row_sizes;
  TableBox *this_local;
  
  iVar1 = this->rows_;
  local_2c = 0;
  row_sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_2d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,(long)iVar1,&local_2c,&local_2d);
  std::allocator<int>::~allocator(&local_2d);
  iVar1 = this->cols_;
  i = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&j + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_58,(long)iVar1,&i,
             (allocator<int> *)((long)&j + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&j + 3));
  for (local_64 = 0; local_64 < this->rows_; local_64 = local_64 + 1) {
    for (local_68 = 0; local_68 < this->cols_; local_68 = local_68 + 1) {
      pvVar2 = std::
               vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
               ::operator[](&this->table_,(long)local_64);
      pvVar3 = std::
               vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
               ::operator[](pvVar2,(long)local_68);
      if (pvVar3->first != (Box *)0x0) {
        pvVar2 = std::
                 vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                 ::operator[](&this->table_,(long)local_64);
        pvVar3 = std::
                 vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 ::operator[](pvVar2,(long)local_68);
        (**pvVar3->first->_vptr_Box)();
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,(long)local_64);
        pvVar2 = std::
                 vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                 ::operator[](&this->table_,(long)local_64);
        pvVar3 = std::
                 vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 ::operator[](pvVar2,(long)local_68);
        current_col = Box::height(pvVar3->first);
        piVar5 = std::max<int>(pvVar4,&current_col);
        iVar1 = *piVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_28,(long)local_64);
        *pvVar4 = iVar1;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,(long)local_68);
        pvVar2 = std::
                 vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                 ::operator[](&this->table_,(long)local_64);
        pvVar3 = std::
                 vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 ::operator[](pvVar2,(long)local_68);
        current_row = Box::width(pvVar3->first);
        piVar5 = std::max<int>(pvVar4,&current_row);
        iVar1 = *piVar5;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_58,(long)local_68);
        *pvVar4 = iVar1;
      }
    }
  }
  i_1 = 0;
  j_1 = 0;
  for (local_7c = 0; local_7c < this->rows_; local_7c = local_7c + 1) {
    i_1 = 0;
    for (local_80 = 0; local_80 < this->cols_; local_80 = local_80 + 1) {
      pvVar2 = std::
               vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
               ::operator[](&this->table_,(long)local_7c);
      pvVar3 = std::
               vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
               ::operator[](pvVar2,(long)local_80);
      if (pvVar3->first != (Box *)0x0) {
        local_88 = std::make_pair<int&,int&>(&j_1,&i_1);
        pvVar2 = std::
                 vector<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>,_std::allocator<std::vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>_>_>
                 ::operator[](&this->table_,(long)local_7c);
        pvVar3 = std::
                 vector<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>,_std::allocator<std::pair<tli_window_manager::Box_*,_std::pair<int,_int>_>_>_>
                 ::operator[](pvVar2,(long)local_80);
        std::pair<int,_int>::operator=(&pvVar3->second,&local_88);
      }
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_58,(long)local_80);
      i_1 = *pvVar4 + i_1;
    }
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_28,(long)local_7c);
    j_1 = *pvVar4 + j_1;
  }
  (this->super_Box).width_ = i_1;
  (this->super_Box).height_ = j_1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_58);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void TableBox::layout() {
    std::vector<int> row_sizes(rows_, 0);
    std::vector<int> col_sizes(cols_, 0);
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            if (table_[i][j].first) {
                table_[i][j].first->layout();
                row_sizes[i] = std::max(row_sizes[i], table_[i][j].first->height());
                col_sizes[j] = std::max(col_sizes[j], table_[i][j].first->width());
            }
        }
    }

    int current_col = 0;
    int current_row = 0;
    for (int i = 0; i < rows_; ++i) {
        current_col = 0;
        for (int j = 0; j < cols_; ++j) {
            if (table_[i][j].first) {
                table_[i][j].second = std::make_pair(current_row, current_col);
            }
            current_col += col_sizes[j];
        }
        current_row += row_sizes[i];
    }

//    for (int i = 0; i < rows_; ++i) {
//        for (int j = 0; j < cols_; ++j) {
//            std::cout << '(' << table_[i][j].second.first << ", " << table_[i][j].second.second << ") ";
//        }
//        std::cout << '\n';
//    }
//    std::cout << '\n';

    width_ = current_col;
    height_ = current_row;
}